

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O2

float * __thiscall Rml::ConvolutionFilter::operator[](ConvolutionFilter *this,int kernel_y_index)

{
  code *pcVar1;
  bool bVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  
  pfVar3 = (this->kernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  iVar4 = (this->kernel_size).y;
  if ((iVar4 <= kernel_y_index || kernel_y_index < 0) || pfVar3 == (float *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(kernel != nullptr && kernel_y_index >= 0 && kernel_y_index < kernel_size.y)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ConvolutionFilter.cpp"
                   ,0x3f);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar4 = (this->kernel_size).y;
    pfVar3 = (this->kernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
  }
  iVar5 = iVar4 + -1;
  if (kernel_y_index < iVar4 + -1) {
    iVar5 = kernel_y_index;
  }
  iVar4 = 0;
  if (-1 < kernel_y_index) {
    iVar4 = iVar5;
  }
  return pfVar3 + (long)iVar4 * (long)(this->kernel_size).x;
}

Assistant:

float* ConvolutionFilter::operator[](int kernel_y_index)
{
	RMLUI_ASSERT(kernel != nullptr && kernel_y_index >= 0 && kernel_y_index < kernel_size.y);

	kernel_y_index = Math::Clamp(kernel_y_index, 0, kernel_size.y - 1);

	return kernel.get() + kernel_size.x * kernel_y_index;
}